

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O3

Loss * __thiscall xLearn::Solver::create_loss(Solver *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Loss *pLVar2;
  ostream *poVar3;
  Logger local_6c;
  string local_68;
  string local_48;
  
  if (GetRegistry_xLearn_loss_registry()::registry == '\0') {
    create_loss();
  }
  std::__cxx11::string::string
            ((string *)&local_68,(this->hyper_param_).loss_func._M_dataplus._M_p,
             (allocator *)&local_48);
  pLVar2 = ObjectCreatorRegistry_xLearn_loss_registry::CreateObject
                     ((ObjectCreatorRegistry_xLearn_loss_registry *)
                      GetRegistry_xLearn_loss_registry()::registry,&local_68);
  paVar1 = &local_68.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (pLVar2 == (Loss *)0x0) {
    local_6c.severity_ = FATAL;
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/solver.cc"
               ,"");
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"create_loss","");
    poVar3 = Logger::Start(FATAL,&local_68,0x61,&local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Cannot create loss: ",0x14);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,(this->hyper_param_).loss_func._M_dataplus._M_p,
               (this->hyper_param_).loss_func._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    Logger::~Logger(&local_6c);
  }
  return pLVar2;
}

Assistant:

Loss* Solver::create_loss() {
  Loss* loss;
  loss = CREATE_LOSS(hyper_param_.loss_func.c_str());
  if (loss == nullptr) {
    LOG(FATAL) << "Cannot create loss: "
               << hyper_param_.loss_func;
  }
  return loss;
}